

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O0

BGPolicyIndex __thiscall AgentBG::GetMaximizingBGIndex(AgentBG *this,JointBeliefInterface *jb)

{
  BGPolicyIndex *betaMaxI_00;
  BGPolicyIndex *pBVar1;
  AgentDecPOMDPDiscrete *in_RDI;
  Index a;
  BGPolicyIndex betaMaxI;
  BGPolicyIndex bI;
  double q;
  double v;
  Index t;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  QAV<PerseusBGPlanner> *this_00;
  QAV<PerseusBGPlanner> *local_28;
  double local_20;
  double local_18;
  
  local_18 = -1.79769313486232e+308;
  this_00 = (QAV<PerseusBGPlanner> *)0x7fffffff;
  uVar2 = 0;
  while( true ) {
    betaMaxI_00 = (BGPolicyIndex *)(ulong)uVar2;
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    pBVar1 = (BGPolicyIndex *)
             PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8faf61);
    if (betaMaxI_00 == pBVar1) break;
    t = (Index)((ulong)in_RDI >> 0x20);
    if (in_RDI[1].super_SimulationAgent._vptr_SimulationAgent == (_func_int **)0x0) {
      local_20 = QAV<PerseusBGNSPlanner>::GetQ
                           ((QAV<PerseusBGNSPlanner> *)this_00,
                            (JointBeliefInterface *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),t,
                            (Index)in_RDI,betaMaxI_00);
    }
    else {
      local_20 = QAV<PerseusBGPlanner>::GetQ
                           (this_00,(JointBeliefInterface *)
                                    CONCAT44(uVar2,in_stack_ffffffffffffffc8),t,betaMaxI_00);
    }
    if (local_18 < local_20) {
      local_18 = local_20;
      this_00 = local_28;
    }
    uVar2 = uVar2 + 1;
  }
  return (BGPolicyIndex)this_00;
}

Assistant:

AlphaVector::BGPolicyIndex
AgentBG::GetMaximizingBGIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    AlphaVector::BGPolicyIndex bI,betaMaxI=INT_MAX;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);

        if(q>v)
        {
            v=q;
            betaMaxI=bI;
        }
    }

#if DEBUG_AgentBG
    cout << "GetMaximizingBGIndex " << GetIndex() << ": betaMaxI " << betaMaxI 
         << " " << jb.SoftPrint() << endl;
#endif
    return(betaMaxI);
}